

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::RenderTextEllipsis
               (ImDrawList *draw_list,ImVec2 *pos_min,ImVec2 *pos_max,float clip_max_x,
               float ellipsis_max_x,char *text,char *text_end_full,ImVec2 *text_size_if_known)

{
  float size;
  ImWchar IVar1;
  ImFont *this;
  char *pcVar2;
  ImWchar c;
  int iVar3;
  ImU32 col;
  ImFontGlyph *pIVar4;
  int iVar5;
  ImGuiContext *pIVar6;
  bool bVar7;
  uint uVar8;
  ImVec2 IVar9;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  float fVar10;
  char *text_end_ellipsis;
  ImDrawList *local_98;
  float local_90;
  float local_8c;
  ImVec2 local_88;
  float local_7c;
  ImVec2 local_78;
  undefined8 uStack_70;
  ImVec2 *local_68;
  char *local_60;
  ImVec2 local_58;
  ImGuiContext *local_50;
  float local_48;
  ImVec2 local_38;
  
  pIVar6 = GImGui;
  local_98 = draw_list;
  local_90 = clip_max_x;
  local_48 = ellipsis_max_x;
  if (text_end_full == (char *)0x0) {
    text_end_full = FindRenderedTextEnd(text,(char *)0x0);
  }
  if (text_size_if_known == (ImVec2 *)0x0) {
    local_58 = CalcTextSize(text,text_end_full,false,0.0);
  }
  else {
    local_58 = *text_size_if_known;
  }
  if (local_58.x <= pos_max->x - pos_min->x) {
    text_end_ellipsis = (char *)CONCAT44(pos_max->y,local_90);
    local_88.x = 0.0;
    local_88.y = 0.0;
    RenderTextClippedEx(local_98,pos_min,(ImVec2 *)&text_end_ellipsis,text,text_end_full,&local_58,
                        &local_88,(ImRect *)0x0);
  }
  else {
    local_50 = pIVar6;
    this = local_98->_Data->Font;
    size = local_98->_Data->FontSize;
    text_end_ellipsis = (char *)0x0;
    IVar1 = this->EllipsisChar;
    if (IVar1 == 0xffff) {
      c = this->DotChar;
      iVar5 = 3;
    }
    else {
      iVar5 = 1;
      c = IVar1;
    }
    local_68 = pos_max;
    local_60 = text_end_full;
    pIVar4 = ImFont::FindGlyph(this,c);
    pcVar2 = local_60;
    local_7c = pIVar4->X1;
    local_8c = local_7c;
    if (IVar1 == 0xffff) {
      fVar10 = local_98->_Data->FontSize / this->FontSize;
      local_8c = (local_7c - pIVar4->X0) + fVar10;
      local_7c = (float)iVar5 * local_8c - fVar10;
    }
    uVar8 = -(uint)(local_48 <= local_68->x);
    fVar10 = ((float)(~uVar8 & (uint)local_48 | (uint)local_68->x & uVar8) - local_7c) - pos_min->x;
    if (fVar10 <= 1.0) {
      fVar10 = 1.0;
    }
    local_78 = ImFont::CalcTextSizeA(this,size,fVar10,0.0,text,local_60,&text_end_ellipsis);
    uStack_70 = extraout_XMM0_Qb;
    if (text_end_ellipsis < pcVar2 && text_end_ellipsis == text) {
      iVar3 = ImTextCountUtf8BytesFromChar(text,pcVar2);
      text_end_ellipsis = text + iVar3;
      local_78 = ImFont::CalcTextSizeA
                           (this,size,3.4028235e+38,0.0,text,text_end_ellipsis,(char **)0x0);
      uStack_70 = extraout_XMM0_Qb_00;
    }
    while ((pcVar2 = text_end_ellipsis, text < text_end_ellipsis &&
           ((text_end_ellipsis[-1] == ' ' || (text_end_ellipsis[-1] == '\t'))))) {
      text_end_ellipsis = text_end_ellipsis + -1;
      IVar9 = ImFont::CalcTextSizeA
                        (this,size,3.4028235e+38,0.0,text_end_ellipsis,pcVar2,(char **)0x0);
      local_78.x = local_78.x - IVar9.x;
    }
    local_88.y = local_68->y;
    local_88.x = local_90;
    local_38.x = 0.0;
    local_38.y = 0.0;
    RenderTextClippedEx(local_98,pos_min,&local_88,text,text_end_ellipsis,&local_58,&local_38,
                        (ImRect *)0x0);
    fVar10 = local_78.x + pos_min->x;
    text_end_full = local_60;
    pIVar6 = local_50;
    if (local_7c + fVar10 <= local_48) {
      while (bVar7 = iVar5 != 0, iVar5 = iVar5 + -1, text_end_full = local_60, pIVar6 = local_50,
            bVar7) {
        local_88.y = pos_min->y;
        local_88.x = fVar10;
        local_78.x = fVar10;
        col = GetColorU32(0,1.0);
        ImFont::RenderChar(this,local_98,size,&local_88,col,c);
        fVar10 = local_78.x + local_8c;
      }
    }
  }
  if (pIVar6->LogEnabled == true) {
    LogRenderedText(pos_min,text,text_end_full);
  }
  return;
}

Assistant:

void ImGui::RenderTextEllipsis(ImDrawList* draw_list, const ImVec2& pos_min, const ImVec2& pos_max, float clip_max_x, float ellipsis_max_x, const char* text, const char* text_end_full, const ImVec2* text_size_if_known)
{
    ImGuiContext& g = *GImGui;
    if (text_end_full == NULL)
        text_end_full = FindRenderedTextEnd(text);
    const ImVec2 text_size = text_size_if_known ? *text_size_if_known : CalcTextSize(text, text_end_full, false, 0.0f);

    //draw_list->AddLine(ImVec2(pos_max.x, pos_min.y - 4), ImVec2(pos_max.x, pos_max.y + 4), IM_COL32(0, 0, 255, 255));
    //draw_list->AddLine(ImVec2(ellipsis_max_x, pos_min.y-2), ImVec2(ellipsis_max_x, pos_max.y+2), IM_COL32(0, 255, 0, 255));
    //draw_list->AddLine(ImVec2(clip_max_x, pos_min.y), ImVec2(clip_max_x, pos_max.y), IM_COL32(255, 0, 0, 255));
    // FIXME: We could technically remove (last_glyph->AdvanceX - last_glyph->X1) from text_size.x here and save a few pixels.
    if (text_size.x > pos_max.x - pos_min.x)
    {
        // Hello wo...
        // |       |   |
        // min   max   ellipsis_max
        //          <-> this is generally some padding value

        const ImFont* font = draw_list->_Data->Font;
        const float font_size = draw_list->_Data->FontSize;
        const char* text_end_ellipsis = NULL;

        ImWchar ellipsis_char = font->EllipsisChar;
        int ellipsis_char_count = 1;
        if (ellipsis_char == (ImWchar)-1)
        {
            ellipsis_char = font->DotChar;
            ellipsis_char_count = 3;
        }
        const ImFontGlyph* glyph = font->FindGlyph(ellipsis_char);

        float ellipsis_glyph_width = glyph->X1;                 // Width of the glyph with no padding on either side
        float ellipsis_total_width = ellipsis_glyph_width;      // Full width of entire ellipsis

        if (ellipsis_char_count > 1)
        {
            // Full ellipsis size without free spacing after it.
            const float spacing_between_dots = 1.0f * (draw_list->_Data->FontSize / font->FontSize);
            ellipsis_glyph_width = glyph->X1 - glyph->X0 + spacing_between_dots;
            ellipsis_total_width = ellipsis_glyph_width * (float)ellipsis_char_count - spacing_between_dots;
        }

        // We can now claim the space between pos_max.x and ellipsis_max.x
        const float text_avail_width = ImMax((ImMax(pos_max.x, ellipsis_max_x) - ellipsis_total_width) - pos_min.x, 1.0f);
        float text_size_clipped_x = font->CalcTextSizeA(font_size, text_avail_width, 0.0f, text, text_end_full, &text_end_ellipsis).x;
        if (text == text_end_ellipsis && text_end_ellipsis < text_end_full)
        {
            // Always display at least 1 character if there's no room for character + ellipsis
            text_end_ellipsis = text + ImTextCountUtf8BytesFromChar(text, text_end_full);
            text_size_clipped_x = font->CalcTextSizeA(font_size, FLT_MAX, 0.0f, text, text_end_ellipsis).x;
        }
        while (text_end_ellipsis > text && ImCharIsBlankA(text_end_ellipsis[-1]))
        {
            // Trim trailing space before ellipsis (FIXME: Supporting non-ascii blanks would be nice, for this we need a function to backtrack in UTF-8 text)
            text_end_ellipsis--;
            text_size_clipped_x -= font->CalcTextSizeA(font_size, FLT_MAX, 0.0f, text_end_ellipsis, text_end_ellipsis + 1).x; // Ascii blanks are always 1 byte
        }

        // Render text, render ellipsis
        RenderTextClippedEx(draw_list, pos_min, ImVec2(clip_max_x, pos_max.y), text, text_end_ellipsis, &text_size, ImVec2(0.0f, 0.0f));
        float ellipsis_x = pos_min.x + text_size_clipped_x;
        if (ellipsis_x + ellipsis_total_width <= ellipsis_max_x)
            for (int i = 0; i < ellipsis_char_count; i++)
            {
                font->RenderChar(draw_list, font_size, ImVec2(ellipsis_x, pos_min.y), GetColorU32(ImGuiCol_Text), ellipsis_char);
                ellipsis_x += ellipsis_glyph_width;
            }
    }
    else
    {
        RenderTextClippedEx(draw_list, pos_min, ImVec2(clip_max_x, pos_max.y), text, text_end_full, &text_size, ImVec2(0.0f, 0.0f));
    }

    if (g.LogEnabled)
        LogRenderedText(&pos_min, text, text_end_full);
}